

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O2

bool tcu::anon_unknown_3::verifyLineGroupPixelIndependentInterpolation
               (Surface *surface,LineSceneSpec *scene,RasterizationArguments *args,TestLog *log,
               LineInterpolationMethod interpolationMethod)

{
  int *value;
  int *value_00;
  int *value_01;
  ostringstream *stream;
  pointer pSVar1;
  RasterizationArguments *pRVar2;
  undefined1 __fd [4];
  bool bVar3;
  int iVar4;
  MessageBuilder *pMVar5;
  ulong uVar6;
  SingleSampleNarrowLineCandidate *__result;
  SingleSampleNarrowLineCandidate *pSVar7;
  ulong uVar8;
  float fVar9;
  size_t __n;
  allocator<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate> *__alloc;
  Surface *surface_00;
  float fVar10;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  int dy;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  LineInterpolationRange *this;
  SingleSampleNarrowLineCandidate *__first;
  uint uVar15;
  int iVar16;
  ChannelOrder CVar17;
  long lVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float __x;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  int local_53c;
  int local_534;
  RGBA color;
  SingleSampleNarrowLineCandidate *local_520;
  Vector<float,_3> local_510;
  RasterizationArguments *local_500;
  Vec4 valueMin;
  long local_4c8;
  Vec4 valueMax;
  IVec3 formatLimit;
  string local_450;
  IVec2 viewportSize;
  Vector<float,_3> local_428;
  float local_418;
  int iStack_414;
  int iStack_410;
  int iStack_40c;
  float local_408;
  float fStack_404;
  float fStack_400;
  uint uStack_3fc;
  string local_3f0;
  IVec3 pixelNativeColor;
  Surface errorMask;
  LineInterpolationRange range;
  undefined1 *local_338;
  float local_330;
  Vector<float,_3> local_328;
  undefined1 *local_318;
  float local_310;
  Vector<float,_3> local_308;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> screenspaceLines;
  Vector<float,_3> local_2dc;
  Vector<float,_3> local_2d0;
  Vector<float,_3> local_2c4;
  Vector<float,_3> local_2b8;
  Vector<float,_3> local_2ac;
  TextureLevel referenceLineMap;
  undefined1 local_278 [4];
  undefined1 auStack_274 [4];
  int iStack_270;
  int iStack_26c;
  Vector<int,_3> VStack_268;
  Vector<float,_3> local_25c;
  Vector<float,_3> VStack_250;
  Vector<float,_3> local_244;
  Vector<float,_3> aVStack_238 [26];
  vector<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate,_std::allocator<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate>_>
  candidates;
  PixelBufferAccess local_58;
  
  viewportSize.m_data[0] = surface->m_width;
  viewportSize.m_data[1] = surface->m_height;
  local_500 = args;
  Surface::Surface(&errorMask,viewportSize.m_data[0],viewportSize.m_data[1]);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&screenspaceLines,
             (long)(scene->lines).
                   super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(scene->lines).
                   super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 6,(allocator_type *)local_278);
  local_278 = (undefined1  [4])0x0;
  auStack_274 = (undefined1  [4])0x1e;
  TextureLevel::TextureLevel
            (&referenceLineMap,(TextureFormat *)local_278,surface->m_width,surface->m_height,1);
  TextureLevel::getAccess((PixelBufferAccess *)local_278,&referenceLineMap);
  candidates.
  super__Vector_base<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate,_std::allocator<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  candidates.
  super__Vector_base<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate,_std::allocator<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  tcu::clear((PixelBufferAccess *)local_278,(IVec4 *)&candidates);
  Surface::getAccess((PixelBufferAccess *)local_278,&errorMask);
  candidates.
  super__Vector_base<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate,_std::allocator<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate>_>
  ._M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0x3f80000000000000) << 0x40;
  tcu::clear((PixelBufferAccess *)local_278,(Vec4 *)&candidates);
  local_278 = SUB84(log,0);
  __fd = local_278;
  _local_278 = (TextureFormat)log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&iStack_270);
  pRVar2 = local_500;
  std::operator<<((ostream *)&iStack_270,"Verifying rasterization result. Native format is RGB");
  value = &pRVar2->redBits;
  pMVar5 = MessageBuilder::operator<<((MessageBuilder *)local_278,value);
  value_00 = &pRVar2->greenBits;
  pMVar5 = MessageBuilder::operator<<(pMVar5,value_00);
  value_01 = &pRVar2->blueBits;
  pMVar5 = MessageBuilder::operator<<(pMVar5,value_01);
  MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&iStack_270);
  if (((8 < *value) || (8 < *value_00)) || (8 < *value_01)) {
    _local_278 = (TextureFormat)log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&iStack_270);
    std::operator<<((ostream *)&iStack_270,
                    "Warning! More than 8 bits in a color channel, this may produce false negatives."
                   );
    MessageBuilder::operator<<((MessageBuilder *)local_278,(EndMessageToken *)&TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&iStack_270);
  }
  genScreenSpaceLines(&screenspaceLines,&scene->lines,&viewportSize);
  fVar9 = scene->lineWidth;
  TextureLevel::getAccess(&local_58,&referenceLineMap);
  setMaskMapCoverageBitForLines(&screenspaceLines,fVar9,&local_58);
  local_534 = 0;
  __n = 1;
  local_53c = 0;
  do {
    fVar9 = (float)__n;
    if (surface->m_height + -1 <= (int)fVar9) {
      if (4 < local_53c) {
        _local_278 = (TextureFormat)log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&iStack_270);
        std::operator<<((ostream *)&iStack_270,"Omitted ");
        std::ostream::operator<<((ostringstream *)&iStack_270,local_53c + -4);
        std::operator<<((ostream *)&iStack_270," pixel error description(s).");
        MessageBuilder::operator<<
                  ((MessageBuilder *)local_278,(EndMessageToken *)&TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&iStack_270);
      }
      if (local_534 == 0) {
        _local_278 = (TextureFormat)log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&iStack_270);
        std::operator<<((ostream *)&iStack_270,"No invalid pixels found.");
        MessageBuilder::operator<<
                  ((MessageBuilder *)local_278,(EndMessageToken *)&TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&iStack_270);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&range,"Verification result",(allocator<char> *)&pixelNativeColor);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&valueMin,"Result of rendering",(allocator<char> *)&formatLimit);
        LogImageSet::LogImageSet((LogImageSet *)&candidates,(string *)&range,(string *)&valueMin);
        LogImageSet::write((LogImageSet *)&candidates,(int)__fd,__buf_02,__n);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&valueMax,"Result",(allocator<char> *)&local_3f0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_450,"Result",(allocator<char> *)&local_510);
        LogImage::LogImage((LogImage *)local_278,(string *)&valueMax,&local_450,surface,
                           QP_IMAGE_COMPRESSION_MODE_BEST);
        LogImage::write((LogImage *)local_278,(int)__fd,__buf_03,(size_t)surface);
        TestLog::endImageSet(log);
        LogImage::~LogImage((LogImage *)local_278);
        std::__cxx11::string::~string((string *)&local_450);
        std::__cxx11::string::~string((string *)&valueMax);
        LogImageSet::~LogImageSet((LogImageSet *)&candidates);
        std::__cxx11::string::~string((string *)&valueMin);
        this = &range;
      }
      else {
        _local_278 = (TextureFormat)log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&iStack_270);
        std::ostream::operator<<((ostringstream *)&iStack_270,local_534);
        std::operator<<((ostream *)&iStack_270," invalid pixel(s) found.");
        MessageBuilder::operator<<
                  ((MessageBuilder *)local_278,(EndMessageToken *)&TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&iStack_270);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&valueMin,"Verification result",(allocator<char> *)&local_510);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&valueMax,"Result of rendering",(allocator<char> *)&local_2b8);
        LogImageSet::LogImageSet((LogImageSet *)&range,(string *)&valueMin,(string *)&valueMax);
        LogImageSet::write((LogImageSet *)&range,(int)__fd,__buf,__n);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_450,"Result",(allocator<char> *)&local_2c4);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&pixelNativeColor,"Result",(allocator<char> *)&local_428);
        LogImage::LogImage((LogImage *)local_278,&local_450,(string *)&pixelNativeColor,surface,
                           QP_IMAGE_COMPRESSION_MODE_BEST);
        LogImage::write((LogImage *)local_278,(int)__fd,__buf_00,(size_t)surface);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&formatLimit,"ErrorMask",(allocator<char> *)&local_2d0);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_3f0,"ErrorMask",(allocator<char> *)&local_2dc);
        surface_00 = &errorMask;
        LogImage::LogImage((LogImage *)&candidates,(string *)&formatLimit,&local_3f0,surface_00,
                           QP_IMAGE_COMPRESSION_MODE_BEST);
        LogImage::write((LogImage *)&candidates,(int)__fd,__buf_01,(size_t)surface_00);
        TestLog::endImageSet(log);
        LogImage::~LogImage((LogImage *)&candidates);
        std::__cxx11::string::~string((string *)&local_3f0);
        std::__cxx11::string::~string((string *)&formatLimit);
        LogImage::~LogImage((LogImage *)local_278);
        std::__cxx11::string::~string((string *)&pixelNativeColor);
        std::__cxx11::string::~string((string *)&local_450);
        LogImageSet::~LogImageSet((LogImageSet *)&range);
        std::__cxx11::string::~string((string *)&valueMax);
        this = (LineInterpolationRange *)&valueMin;
      }
      std::__cxx11::string::~string((string *)this);
      TextureLevel::~TextureLevel(&referenceLineMap);
      std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::
      ~_Vector_base(&screenspaceLines.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   );
      Surface::~Surface(&errorMask);
      return local_534 == 0;
    }
    iVar4 = 0;
    for (fVar10 = 1.4013e-45; pRVar2 = local_500, (int)fVar10 < surface->m_width + -1;
        fVar10 = (float)((int)fVar10 + 1)) {
      color.m_value =
           *(deUint32 *)
            ((long)(surface->m_pixels).m_ptr +
            (long)(surface->m_width * (int)fVar9 + (int)fVar10) * 4);
      convertRGB8ToNativeFormat((anon_unknown_3 *)&pixelNativeColor,&color,local_500);
      formatLimit.m_data[0] = ~(-1 << ((byte)pRVar2->redBits & 0x1f));
      formatLimit.m_data[1] = ~(-1 << ((byte)pRVar2->greenBits & 0x1f));
      formatLimit.m_data[2] = ~(-1 << ((byte)pRVar2->blueBits & 0x1f));
      candidates.
      super__Vector_base<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate,_std::allocator<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      candidates.
      super__Vector_base<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate,_std::allocator<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      candidates.
      super__Vector_base<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate,_std::allocator<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      uVar12 = 0xffff;
      uVar15 = 0;
      for (iVar11 = -1; iVar11 != 2; iVar11 = iVar11 + 1) {
        for (iVar16 = 0; iVar16 != 3; iVar16 = iVar16 + 1) {
          TextureLevel::getAccess((PixelBufferAccess *)local_278,&referenceLineMap);
          ConstPixelBufferAccess::getPixelInt
                    ((ConstPixelBufferAccess *)&range,(int)(PixelBufferAccess *)local_278,
                     iVar4 + iVar16,iVar11 + (int)fVar9);
          uVar15 = uVar15 | (uint)range.max.m_data[0];
          uVar12 = uVar12 & (uint)range.max.m_data[0];
        }
      }
      if (uVar12 == 0) {
        local_278 = (undefined1  [4])0xff000000;
        bVar3 = compareColors(&color,(RGBA *)local_278,*value,*value_00,*value_01);
        if (!bVar3) goto LAB_0094db77;
      }
      else {
LAB_0094db77:
        local_4c8 = 0x30;
        lVar14 = 0;
        local_520 = (SingleSampleNarrowLineCandidate *)0x0;
        lVar18 = 0;
        __first = (SingleSampleNarrowLineCandidate *)0x0;
        while( true ) {
          pSVar1 = (scene->lines).
                   super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((int)((ulong)((long)(scene->lines).
                                  super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1) >> 6)
              <= lVar18) break;
          CVar17 = (ChannelOrder)lVar18;
          __result = __first;
          if ((uVar15 >> (CVar17 & (sBGR|sRGBA)) & 1) != 0) {
            fVar20 = *(float *)((long)pSVar1->positions[0].m_data + lVar14 * 4 + 0xc);
            fVar19 = *(float *)((long)pSVar1->colors[0].m_data + lVar14 * 4 + 0xfffffffffffffffcU);
            local_3f0._M_dataplus._M_p =
                 *(pointer *)
                  ((long)(screenspaceLines.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar14);
            local_510.m_data._0_8_ =
                 *(undefined8 *)
                  ((long)(screenspaceLines.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar14 + 8);
            if (interpolationMethod == LINEINTERPOLATION_STRICTLY_CORRECT) {
              local_278 = (undefined1  [4])fVar10;
              auStack_274 = (undefined1  [4])fVar9;
              calcSingleSampleLineInterpolationRange
                        ((anon_unknown_3 *)&range,(Vec2 *)&local_3f0,fVar20,(Vec2 *)&local_510,
                         fVar19,(IVec2 *)local_278,local_500->subpixelBits);
            }
            else {
              valueMin.m_data[0] = fVar10;
              valueMin.m_data[1] = fVar9;
              tcu::(anonymous_namespace)::
              calcSingleSampleLineInterpolationRangeWithWeightEquation<tcu::(anonymous_namespace)::LineInterpolationRange(*)(tcu::Vector<float,2>const&,float,tcu::Vector<float,2>const&,float,tcu::Vector<float,2>const&)>
                        ((_anonymous_namespace_ *)&range,(Vec2 *)&local_3f0,fVar20,
                         (Vec2 *)&local_510,fVar19,(IVec2 *)&valueMin,local_500->subpixelBits,
                         calcLineInterpolationWeightsAxisProjected);
            }
            fVar19 = 1.0;
            if (range.min.m_data[0] <= 1.0) {
              fVar19 = range.min.m_data[0];
            }
            tcu::operator*((tcu *)local_278,
                           (float)(~-(uint)(range.min.m_data[0] < 0.0) & (uint)fVar19),
                           (Vector<float,_4> *)
                           ((long)(((scene->lines).
                                    super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->positions +
                                  0xffffffffffffffff) + local_4c8));
            fVar19 = 1.0;
            if (range.min.m_data[1] <= 1.0) {
              fVar19 = range.min.m_data[1];
            }
            tcu::operator*((tcu *)&valueMax,
                           (float)(~-(uint)(range.min.m_data[1] < 0.0) & (uint)fVar19),
                           (Vector<float,_4> *)
                           ((long)((scene->lines).
                                   super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->positions[0].m_data +
                           local_4c8));
            tcu::operator+((tcu *)&valueMin,(Vector<float,_4> *)local_278,
                           (Vector<float,_4> *)&valueMax);
            fVar19 = 1.0;
            if (range.max.m_data[0] <= 1.0) {
              fVar19 = range.max.m_data[0];
            }
            tcu::operator*((tcu *)local_278,
                           (float)(~-(uint)(range.max.m_data[0] < 0.0) & (uint)fVar19),
                           (Vector<float,_4> *)
                           ((long)(((scene->lines).
                                    super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->positions +
                                  0xffffffffffffffff) + local_4c8));
            fVar19 = 1.0;
            if (range.max.m_data[1] <= 1.0) {
              fVar19 = range.max.m_data[1];
            }
            tcu::operator*((tcu *)&local_450,
                           (float)(~-(uint)(range.max.m_data[1] < 0.0) & (uint)fVar19),
                           (Vector<float,_4> *)
                           ((long)((scene->lines).
                                   super__Vector_base<tcu::LineSceneSpec::SceneLine,_std::allocator<tcu::LineSceneSpec::SceneLine>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->positions[0].m_data +
                           local_4c8));
            tcu::operator+((tcu *)&valueMax,(Vector<float,_4> *)local_278,
                           (Vector<float,_4> *)&local_450);
            auVar23._0_4_ = (float)formatLimit.m_data[0];
            auVar26._0_4_ = (float)formatLimit.m_data[1];
            auVar26._4_4_ = (float)formatLimit.m_data[2];
            auVar26._8_8_ = 0;
            auVar23._4_4_ = auVar26._0_4_;
            auVar23._8_4_ = auVar26._4_4_;
            auVar23._12_4_ = auVar23._0_4_;
            auVar24._4_4_ = valueMin.m_data[1] * auVar26._0_4_;
            auVar24._0_4_ = valueMin.m_data[0] * auVar23._0_4_;
            auVar24._8_4_ = valueMin.m_data[2] * auVar26._4_4_;
            auVar24._12_4_ = valueMax.m_data[0] * auVar23._0_4_;
            auVar24 = minps(auVar23,auVar24);
            local_408 = (float)(-(uint)(0.0 <= valueMin.m_data[0] * auVar23._0_4_) & auVar24._0_4_);
            fStack_404 = (float)(-(uint)(0.0 <= valueMin.m_data[1] * auVar26._0_4_) & auVar24._4_4_)
            ;
            fStack_400 = (float)(-(uint)(0.0 <= valueMin.m_data[2] * auVar26._4_4_) & auVar24._8_4_)
            ;
            uStack_3fc = -(uint)(0.0 <= valueMax.m_data[0] * auVar23._0_4_) & auVar24._12_4_;
            auVar25._0_4_ = valueMax.m_data[1] * auVar26._0_4_;
            auVar25._4_4_ = valueMax.m_data[2] * auVar26._4_4_;
            auVar25._8_8_ = 0;
            auVar24 = minps(auVar26,auVar25);
            fVar19 = (float)(-(uint)(0.0 <= auVar25._0_4_) & auVar24._0_4_);
            __x = (float)(-(uint)(0.0 <= auVar25._4_4_) & auVar24._4_4_);
            local_418 = floorf(fStack_400);
            fVar20 = ceilf(fStack_404);
            fVar21 = floorf(local_408);
            fVar22 = floorf(fStack_404);
            iStack_414 = (int)fVar22;
            iStack_410 = (int)local_418;
            iStack_40c = (int)fVar20;
            local_418 = (float)(int)fVar21;
            fVar20 = ceilf(fVar19);
            fVar21 = ceilf(__x);
            if (((((int)local_418 <= pixelNativeColor.m_data[0]) &&
                 (iStack_414 <= pixelNativeColor.m_data[1])) &&
                ((iStack_410 <= pixelNativeColor.m_data[2] &&
                 ((pixelNativeColor.m_data[0] <= iStack_40c &&
                  (pixelNativeColor.m_data[1] <= (int)fVar20)))))) &&
               (pixelNativeColor.m_data[2] <= (int)fVar21)) goto LAB_0094e5c0;
            if (local_53c < 4) {
              Vector<int,_3>::Vector((Vector<int,_3> *)(local_278 + 4));
              Vector<int,_3>::Vector(&VStack_268);
              Vector<float,_3>::Vector(&local_25c);
              Vector<float,_3>::Vector(&VStack_250);
              Vector<float,_3>::Vector(&local_244);
              Vector<float,_3>::Vector(aVStack_238);
              unique0x100016fd = iStack_40c;
              iStack_26c = iStack_410;
              auStack_274 = (undefined1  [4])local_418;
              iStack_270 = iStack_414;
              VStack_268.m_data[2] = (int)fVar21;
              VStack_268.m_data[1] = (int)fVar20;
              local_25c.m_data[1] = fStack_404;
              local_25c.m_data[0] = local_408;
              unique0x1000170d = uStack_3fc;
              local_25c.m_data[2] = fStack_400;
              VStack_250.m_data[2] = __x;
              VStack_250.m_data[1] = fVar19;
              local_244.m_data[0] = valueMin.m_data[0];
              local_244.m_data[1] = valueMin.m_data[1];
              local_244.m_data[2] = valueMin.m_data[2];
              aVStack_238[0].m_data[0] = valueMax.m_data[0];
              aVStack_238[0].m_data[1] = valueMax.m_data[1];
              aVStack_238[0].m_data[2] = valueMax.m_data[2];
              local_278 = (undefined1  [4])CVar17;
              if (local_520 ==
                  candidates.
                  super__Vector_base<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate,_std::allocator<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                if ((long)local_520 - (long)__first == 0x7fffffffffffffc8) {
                  std::__throw_length_error("vector::_M_realloc_insert");
                }
                uVar6 = ((long)local_520 - (long)__first) / 0x4c;
                uVar8 = uVar6;
                if (local_520 == __first) {
                  uVar8 = 1;
                }
                uVar13 = uVar8 + uVar6;
                __alloc = (allocator<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate> *)
                          0x1af286bca1af286;
                if (0x1af286bca1af285 < uVar13) {
                  uVar13 = 0x1af286bca1af286;
                }
                if (CARRY8(uVar8,uVar6)) {
                  uVar13 = 0x1af286bca1af286;
                }
                if (uVar13 == 0) {
                  __result = (SingleSampleNarrowLineCandidate *)0x0;
                }
                else {
                  __result = (SingleSampleNarrowLineCandidate *)operator_new(uVar13 * 0x4c);
                }
                SingleSampleNarrowLineCandidate::SingleSampleNarrowLineCandidate
                          (__result + uVar6,(SingleSampleNarrowLineCandidate *)local_278);
                pSVar7 = std::
                         __uninitialized_move_if_noexcept_a<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate*,tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate*,std::allocator<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate>>
                                   (__first,local_520,__result,__alloc);
                local_520 = std::
                            __uninitialized_move_if_noexcept_a<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate*,tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate*,std::allocator<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate>>
                                      (local_520,local_520,pSVar7 + 1,__alloc);
                std::
                _Vector_base<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate,_std::allocator<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate>_>
                ::_M_deallocate((_Vector_base<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate,_std::allocator<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate>_>
                                 *)__first,
                                (pointer)(((long)candidates.
                                                 super__Vector_base<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate,_std::allocator<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate>_>
                                                 ._M_impl.super__Vector_impl_data._M_end_of_storage
                                          - (long)__first) / 0x4c),
                                ((long)candidates.
                                       super__Vector_base<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate,_std::allocator<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)__first) % 0x4c);
                candidates.
                super__Vector_base<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate,_std::allocator<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate>_>
                ._M_impl.super__Vector_impl_data._M_finish = local_520;
                candidates.
                super__Vector_base<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate,_std::allocator<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate>_>
                ._M_impl.super__Vector_impl_data._M_start = __result;
                candidates.
                super__Vector_base<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate,_std::allocator<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + uVar13;
              }
              else {
                SingleSampleNarrowLineCandidate::SingleSampleNarrowLineCandidate
                          (local_520,(SingleSampleNarrowLineCandidate *)local_278);
                local_520 = local_520 + 1;
                candidates.
                super__Vector_base<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate,_std::allocator<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate>_>
                ._M_impl.super__Vector_impl_data._M_finish = local_520;
              }
            }
          }
          lVar18 = lVar18 + 1;
          lVar14 = lVar14 + 0x10;
          local_4c8 = local_4c8 + 0x40;
          __first = __result;
        }
        local_534 = local_534 + 1;
        *(undefined4 *)
         ((long)errorMask.m_pixels.m_ptr + (long)(errorMask.m_width * (int)fVar9 + (int)fVar10) * 4)
             = 0xff0000ff;
        local_53c = local_53c + 1;
        if (local_53c < 4) {
          _local_278 = (TextureFormat)log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&iStack_270);
          std::operator<<((ostream *)&iStack_270,"Found an invalid pixel at (");
          std::ostream::operator<<((ostringstream *)&iStack_270,(int)fVar10);
          std::operator<<((ostream *)&iStack_270,",");
          std::ostream::operator<<((ostringstream *)&iStack_270,(int)fVar9);
          std::operator<<((ostream *)&iStack_270,"), ");
          uVar8 = ((long)local_520 - (long)__first) / 0x4c;
          iVar11 = (int)uVar8;
          std::ostream::operator<<((ostringstream *)&iStack_270,iVar11);
          std::operator<<((ostream *)&iStack_270," candidate reference value(s) found:\n");
          std::operator<<((ostream *)&iStack_270,"\tPixel color:\t\t");
          tcu::operator<<((ostream *)&iStack_270,color);
          std::operator<<((ostream *)&iStack_270,"\n");
          std::operator<<((ostream *)&iStack_270,"\tNative color:\t\t");
          tcu::operator<<((ostream *)&iStack_270,&pixelNativeColor);
          std::operator<<((ostream *)&iStack_270,"\n");
          MessageBuilder::operator<<
                    ((MessageBuilder *)local_278,(EndMessageToken *)&TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&iStack_270);
          uVar8 = uVar8 & 0xffffffff;
          if (iVar11 < 1) {
            uVar8 = 0;
          }
          for (lVar14 = 0; uVar8 * 0x4c - lVar14 != 0; lVar14 = lVar14 + 0x4c) {
            _local_278 = (TextureFormat)log;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&iStack_270);
            std::operator<<((ostream *)&iStack_270,"\tCandidate (line ");
            pMVar5 = MessageBuilder::operator<<
                               ((MessageBuilder *)local_278,
                                (int *)((long)(__first->colorMin).m_data + lVar14 + -4));
            stream = &pMVar5->m_str;
            std::operator<<((ostream *)stream,"):\n");
            std::operator<<((ostream *)stream,"\t\tReference native color min: ");
            valueMin.m_data[0] = 0.0;
            valueMin.m_data[1] = 0.0;
            valueMin.m_data[2] = 0.0;
            clamp<int,3>((tcu *)&range,(Vector<int,_3> *)((long)(__first->colorMin).m_data + lVar14)
                         ,(Vector<int,_3> *)&valueMin,&formatLimit);
            tcu::operator<<((ostream *)stream,(Vector<int,_3> *)&range);
            std::operator<<((ostream *)stream,"\n");
            std::operator<<((ostream *)stream,"\t\tReference native color max: ");
            local_450._M_dataplus._M_p = (pointer)0x0;
            local_450._M_string_length._0_4_ = 0;
            clamp<int,3>((tcu *)&valueMax,
                         (Vector<int,_3> *)((long)(__first->colorMax).m_data + lVar14),
                         (Vector<int,_3> *)&local_450,&formatLimit);
            tcu::operator<<((ostream *)stream,(Vector<int,_3> *)&valueMax);
            std::operator<<((ostream *)stream,"\n");
            std::operator<<((ostream *)stream,"\t\tReference native float min: ");
            local_510.m_data[0] = 0.0;
            local_510.m_data[1] = 0.0;
            local_510.m_data[2] = 0.0;
            Vector<int,_3>::cast<float>((Vector<int,_3> *)&local_2b8);
            clamp<float,3>((tcu *)&local_3f0,
                           (Vector<float,_3> *)((long)(__first->colorMinF).m_data + lVar14),
                           &local_510,&local_2b8);
            tcu::operator<<((ostream *)stream,(Vector<float,_3> *)&local_3f0);
            std::operator<<((ostream *)stream,"\n");
            std::operator<<((ostream *)stream,"\t\tReference native float max: ");
            local_428.m_data[0] = 0.0;
            local_428.m_data[1] = 0.0;
            local_428.m_data[2] = 0.0;
            Vector<int,_3>::cast<float>((Vector<int,_3> *)&local_2d0);
            clamp<float,3>((tcu *)&local_2c4,
                           (Vector<float,_3> *)((long)(__first->colorMaxF).m_data + lVar14),
                           &local_428,&local_2d0);
            tcu::operator<<((ostream *)stream,&local_2c4);
            std::operator<<((ostream *)stream,"\n");
            std::operator<<((ostream *)stream,"\t\tFmin:\t");
            local_308.m_data[0] = 0.0;
            local_308.m_data[1] = 0.0;
            local_308.m_data[2] = 0.0;
            local_318 = &DAT_3f8000003f800000;
            local_310 = 1.0;
            clamp<float,3>((tcu *)&local_2dc,
                           (Vector<float,_3> *)((long)(__first->valueRangeMin).m_data + lVar14),
                           &local_308,(Vector<float,_3> *)&local_318);
            tcu::operator<<((ostream *)stream,&local_2dc);
            std::operator<<((ostream *)stream,"\n");
            std::operator<<((ostream *)stream,"\t\tFmax:\t");
            local_328.m_data[0] = 0.0;
            local_328.m_data[1] = 0.0;
            local_328.m_data[2] = 0.0;
            local_338 = &DAT_3f8000003f800000;
            local_330 = 1.0;
            clamp<float,3>((tcu *)&local_2ac,
                           (Vector<float,_3> *)((long)(__first->valueRangeMax).m_data + lVar14),
                           &local_328,(Vector<float,_3> *)&local_338);
            tcu::operator<<((ostream *)stream,&local_2ac);
            std::operator<<((ostream *)stream,"\n");
            MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&iStack_270);
          }
        }
      }
LAB_0094e5c0:
      std::
      vector<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate,_std::allocator<tcu::(anonymous_namespace)::SingleSampleNarrowLineCandidate>_>
      ::~vector(&candidates);
      iVar4 = iVar4 + 1;
    }
    __n = (size_t)((int)fVar9 + 1);
  } while( true );
}

Assistant:

bool verifyLineGroupPixelIndependentInterpolation (const tcu::Surface&				surface,
												   const LineSceneSpec&				scene,
												   const RasterizationArguments&	args,
												   tcu::TestLog&					log,
												   LineInterpolationMethod			interpolationMethod)
{
	DE_ASSERT(scene.lines.size() < 8); // coverage indices are stored as bitmask in a unsigned 8-bit ints
	DE_ASSERT(interpolationMethod == LINEINTERPOLATION_STRICTLY_CORRECT || interpolationMethod == LINEINTERPOLATION_PROJECTED);

	const tcu::RGBA			invalidPixelColor	= tcu::RGBA(255, 0, 0, 255);
	const tcu::IVec2		viewportSize		= tcu::IVec2(surface.getWidth(), surface.getHeight());
	const int				errorFloodThreshold	= 4;
	int						errorCount			= 0;
	tcu::Surface			errorMask			(surface.getWidth(), surface.getHeight());
	int						invalidPixels		= 0;
	std::vector<tcu::Vec4>	screenspaceLines	(scene.lines.size()); //!< packed (x0, y0, x1, y1)

	// Reference renderer produces correct fragments using the diamond-exit-rule. Make 2D int array, store line coverage as a 8-bit bitfield
	// The map is used to find lines with potential coverage to a given pixel
	tcu::TextureLevel		referenceLineMap	(tcu::TextureFormat(tcu::TextureFormat::R, tcu::TextureFormat::UNSIGNED_INT8), surface.getWidth(), surface.getHeight());

	tcu::clear(referenceLineMap.getAccess(), tcu::IVec4(0, 0, 0, 0));
	tcu::clear(errorMask.getAccess(), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));

	// log format

	log << tcu::TestLog::Message << "Verifying rasterization result. Native format is RGB" << args.redBits << args.greenBits << args.blueBits << tcu::TestLog::EndMessage;
	if (args.redBits > 8 || args.greenBits > 8 || args.blueBits > 8)
		log << tcu::TestLog::Message << "Warning! More than 8 bits in a color channel, this may produce false negatives." << tcu::TestLog::EndMessage;

	// prepare lookup map

	genScreenSpaceLines(screenspaceLines, scene.lines, viewportSize);
	setMaskMapCoverageBitForLines(screenspaceLines, scene.lineWidth, referenceLineMap.getAccess());

	// Find all possible lines with coverage, check pixel color matches one of them

	for (int y = 1; y < surface.getHeight() - 1; ++y)
	for (int x = 1; x < surface.getWidth()  - 1; ++x)
	{
		const tcu::RGBA		color					= surface.getPixel(x, y);
		const tcu::IVec3	pixelNativeColor		= convertRGB8ToNativeFormat(color, args);	// Convert pixel color from rgba8 to the real pixel format. Usually rgba8 or 565
		int					lineCoverageSet			= 0;										// !< lines that may cover this fragment
		int					lineSurroundingCoverage = 0xFFFF;									// !< lines that will cover this fragment
		bool				matchFound				= false;
		const tcu::IVec3	formatLimit				((1 << args.redBits) - 1, (1 << args.greenBits) - 1, (1 << args.blueBits) - 1);

		std::vector<SingleSampleNarrowLineCandidate> candidates;

		// Find lines with possible coverage

		for (int dy = -1; dy < 2; ++dy)
		for (int dx = -1; dx < 2; ++dx)
		{
			const int coverage = referenceLineMap.getAccess().getPixelInt(x+dx, y+dy).x();

			lineCoverageSet			|= coverage;
			lineSurroundingCoverage	&= coverage;
		}

		// background color is possible?
		if (lineSurroundingCoverage == 0 && compareColors(color, tcu::RGBA::black(), args.redBits, args.greenBits, args.blueBits))
			continue;

		// Check those lines

		for (int lineNdx = 0; lineNdx < (int)scene.lines.size(); ++lineNdx)
		{
			if (((lineCoverageSet >> lineNdx) & 0x01) != 0)
			{
				const float						wa				= scene.lines[lineNdx].positions[0].w();
				const float						wb				= scene.lines[lineNdx].positions[1].w();
				const tcu::Vec2					pa				= screenspaceLines[lineNdx].swizzle(0, 1);
				const tcu::Vec2					pb				= screenspaceLines[lineNdx].swizzle(2, 3);

				const LineInterpolationRange	range			= (interpolationMethod == LINEINTERPOLATION_STRICTLY_CORRECT)
																	? (calcSingleSampleLineInterpolationRange(pa, wa, pb, wb, tcu::IVec2(x, y), args.subpixelBits))
																	: (calcSingleSampleLineInterpolationRangeAxisProjected(pa, wa, pb, wb, tcu::IVec2(x, y), args.subpixelBits));

				const tcu::Vec4					valueMin		= de::clamp(range.min.x(), 0.0f, 1.0f) * scene.lines[lineNdx].colors[0] + de::clamp(range.min.y(), 0.0f, 1.0f) * scene.lines[lineNdx].colors[1];
				const tcu::Vec4					valueMax		= de::clamp(range.max.x(), 0.0f, 1.0f) * scene.lines[lineNdx].colors[0] + de::clamp(range.max.y(), 0.0f, 1.0f) * scene.lines[lineNdx].colors[1];

				const tcu::Vec3					colorMinF		(de::clamp(valueMin.x() * (float)formatLimit.x(), 0.0f, (float)formatLimit.x()),
																 de::clamp(valueMin.y() * (float)formatLimit.y(), 0.0f, (float)formatLimit.y()),
																 de::clamp(valueMin.z() * (float)formatLimit.z(), 0.0f, (float)formatLimit.z()));
				const tcu::Vec3					colorMaxF		(de::clamp(valueMax.x() * (float)formatLimit.x(), 0.0f, (float)formatLimit.x()),
																 de::clamp(valueMax.y() * (float)formatLimit.y(), 0.0f, (float)formatLimit.y()),
																 de::clamp(valueMax.z() * (float)formatLimit.z(), 0.0f, (float)formatLimit.z()));
				const tcu::IVec3				colorMin		((int)deFloatFloor(colorMinF.x()),
																 (int)deFloatFloor(colorMinF.y()),
																 (int)deFloatFloor(colorMinF.z()));
				const tcu::IVec3				colorMax		((int)deFloatCeil (colorMaxF.x()),
																 (int)deFloatCeil (colorMaxF.y()),
																 (int)deFloatCeil (colorMaxF.z()));

				// Verify validity
				if (pixelNativeColor.x() < colorMin.x() ||
					pixelNativeColor.y() < colorMin.y() ||
					pixelNativeColor.z() < colorMin.z() ||
					pixelNativeColor.x() > colorMax.x() ||
					pixelNativeColor.y() > colorMax.y() ||
					pixelNativeColor.z() > colorMax.z())
				{
					if (errorCount < errorFloodThreshold)
					{
						// Store candidate information for logging
						SingleSampleNarrowLineCandidate candidate;

						candidate.lineNdx		= lineNdx;
						candidate.colorMin		= colorMin;
						candidate.colorMax		= colorMax;
						candidate.colorMinF		= colorMinF;
						candidate.colorMaxF		= colorMaxF;
						candidate.valueRangeMin	= valueMin.swizzle(0, 1, 2);
						candidate.valueRangeMax	= valueMax.swizzle(0, 1, 2);

						candidates.push_back(candidate);
					}
				}
				else
				{
					matchFound = true;
					break;
				}
			}
		}

		if (matchFound)
			continue;

		// invalid fragment
		++invalidPixels;
		errorMask.setPixel(x, y, invalidPixelColor);

		++errorCount;

		// don't fill the logs with too much data
		if (errorCount < errorFloodThreshold)
		{
			log << tcu::TestLog::Message
				<< "Found an invalid pixel at (" << x << "," << y << "), " << (int)candidates.size() << " candidate reference value(s) found:\n"
				<< "\tPixel color:\t\t" << color << "\n"
				<< "\tNative color:\t\t" << pixelNativeColor << "\n"
				<< tcu::TestLog::EndMessage;

			for (int candidateNdx = 0; candidateNdx < (int)candidates.size(); ++candidateNdx)
			{
				const SingleSampleNarrowLineCandidate& candidate = candidates[candidateNdx];

				log << tcu::TestLog::Message << "\tCandidate (line " << candidate.lineNdx << "):\n"
					<< "\t\tReference native color min: " << tcu::clamp(candidate.colorMin, tcu::IVec3(0,0,0), formatLimit) << "\n"
					<< "\t\tReference native color max: " << tcu::clamp(candidate.colorMax, tcu::IVec3(0,0,0), formatLimit) << "\n"
					<< "\t\tReference native float min: " << tcu::clamp(candidate.colorMinF, tcu::Vec3(0.0f, 0.0f, 0.0f), formatLimit.cast<float>()) << "\n"
					<< "\t\tReference native float max: " << tcu::clamp(candidate.colorMaxF, tcu::Vec3(0.0f, 0.0f, 0.0f), formatLimit.cast<float>()) << "\n"
					<< "\t\tFmin:\t" << tcu::clamp(candidate.valueRangeMin, tcu::Vec3(0.0f, 0.0f, 0.0f), tcu::Vec3(1.0f, 1.0f, 1.0f)) << "\n"
					<< "\t\tFmax:\t" << tcu::clamp(candidate.valueRangeMax, tcu::Vec3(0.0f, 0.0f, 0.0f), tcu::Vec3(1.0f, 1.0f, 1.0f)) << "\n"
					<< tcu::TestLog::EndMessage;
			}
		}
	}

	// don't just hide failures
	if (errorCount > errorFloodThreshold)
		log << tcu::TestLog::Message << "Omitted " << (errorCount-errorFloodThreshold) << " pixel error description(s)." << tcu::TestLog::EndMessage;

	// report result
	if (invalidPixels)
	{
		log << tcu::TestLog::Message << invalidPixels << " invalid pixel(s) found." << tcu::TestLog::EndMessage;
		log << tcu::TestLog::ImageSet("Verification result", "Result of rendering")
			<< tcu::TestLog::Image("Result", "Result",			surface)
			<< tcu::TestLog::Image("ErrorMask", "ErrorMask",	errorMask)
			<< tcu::TestLog::EndImageSet;

		return false;
	}
	else
	{
		log << tcu::TestLog::Message << "No invalid pixels found." << tcu::TestLog::EndMessage;
		log << tcu::TestLog::ImageSet("Verification result", "Result of rendering")
			<< tcu::TestLog::Image("Result", "Result", surface)
			<< tcu::TestLog::EndImageSet;

		return true;
	}
}